

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O3

string * __thiscall CLI::Option::matching_name_abi_cxx11_(Option *this,Option *other)

{
  string *psVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  __type _Var5;
  byte bVar6;
  string *psVar7;
  string *psVar8;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_ == '\0') {
    matching_name_abi_cxx11_();
  }
  bVar6 = (other->super_OptionBase<CLI::Option>).configurable_ &
          (this->super_OptionBase<CLI::Option>).configurable_;
  psVar7 = (this->snames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->snames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar1) {
    do {
      pcVar2 = (psVar7->_M_dataplus)._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,pcVar2 + psVar7->_M_string_length);
      bVar4 = check_sname(other,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (bVar4) {
        return psVar7;
      }
      if (bVar6 != 0) {
        pcVar2 = (psVar7->_M_dataplus)._M_p;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,pcVar2,pcVar2 + psVar7->_M_string_length);
        bVar4 = check_lname(other,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        if (bVar4) {
          return psVar7;
        }
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar1);
  }
  psVar7 = (this->lnames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->lnames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar7 != psVar1) {
    do {
      pcVar2 = (psVar7->_M_dataplus)._M_p;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar2,pcVar2 + psVar7->_M_string_length);
      bVar4 = check_lname(other,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (bVar4) {
        return psVar7;
      }
      if ((psVar7->_M_string_length == 1 & bVar6) == 1) {
        pcVar2 = (psVar7->_M_dataplus)._M_p;
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        ::std::__cxx11::string::_M_construct<char*>((string *)&local_f0,pcVar2,pcVar2 + 1);
        bVar4 = check_sname(other,&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if (bVar4) {
          return psVar7;
        }
      }
      psVar7 = psVar7 + 1;
    } while (psVar7 != psVar1);
  }
  if (bVar6 != 0) {
    if ((((this->snames_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (this->snames_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) &&
        ((this->lnames_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->lnames_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       (sVar3 = (this->pname_)._M_string_length, sVar3 != 0)) {
      psVar7 = &this->pname_;
      pcVar2 = (psVar7->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + sVar3);
      bVar4 = check_sname(other,&local_50);
      _Var5 = true;
      if (!bVar4) {
        pcVar2 = (this->pname_)._M_dataplus._M_p;
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,pcVar2,pcVar2 + (this->pname_)._M_string_length);
        bVar4 = check_lname(other,&local_110);
        _Var5 = true;
        if (!bVar4) {
          _Var5 = ::std::operator==(psVar7,&other->pname_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (_Var5 != false) {
        return psVar7;
      }
    }
    if ((((other->snames_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (other->snames_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) &&
        ((other->fnames_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (other->fnames_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       (sVar3 = (other->pname_)._M_string_length, sVar3 != 0)) {
      psVar7 = &other->pname_;
      pcVar2 = (psVar7->_M_dataplus)._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      ::std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar2,pcVar2 + sVar3);
      bVar4 = check_sname(this,&local_70);
      _Var5 = true;
      if (!bVar4) {
        pcVar2 = (other->pname_)._M_dataplus._M_p;
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_130,pcVar2,pcVar2 + (other->pname_)._M_string_length);
        bVar4 = check_lname(this,&local_130);
        _Var5 = true;
        if (!bVar4) {
          _Var5 = ::std::operator==(&this->pname_,psVar7);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (_Var5 != false) {
        return psVar7;
      }
    }
  }
  if (((this->super_OptionBase<CLI::Option>).ignore_case_ == false) &&
     ((this->super_OptionBase<CLI::Option>).ignore_underscore_ != true)) {
    psVar8 = &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_;
  }
  else {
    psVar7 = (other->snames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (other->snames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar7 != psVar1) {
      do {
        pcVar2 = (psVar7->_M_dataplus)._M_p;
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_150,pcVar2,pcVar2 + psVar7->_M_string_length);
        bVar4 = check_sname(this,&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_dataplus._M_p != &local_150.field_2) {
          operator_delete(local_150._M_dataplus._M_p);
        }
        if (bVar4) {
          return psVar7;
        }
        psVar7 = psVar7 + 1;
      } while (psVar7 != psVar1);
    }
    psVar7 = (other->lnames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (other->lnames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar8 = &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_;
    if (psVar7 != psVar1) {
      do {
        pcVar2 = (psVar7->_M_dataplus)._M_p;
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_170,pcVar2,pcVar2 + psVar7->_M_string_length);
        bVar4 = check_lname(this,&local_170);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p);
        }
        psVar8 = psVar7;
      } while ((!bVar4) &&
              (psVar7 = psVar7 + 1,
              psVar8 = &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_,
              psVar7 != psVar1));
    }
  }
  return psVar8;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const std::string &Option::matching_name(const Option &other) const {
    static const std::string estring;
    bool bothConfigurable = configurable_ && other.configurable_;
    for(const std::string &sname : snames_) {
        if(other.check_sname(sname))
            return sname;
        if(bothConfigurable && other.check_lname(sname))
            return sname;
    }
    for(const std::string &lname : lnames_) {
        if(other.check_lname(lname))
            return lname;
        if(lname.size() == 1 && bothConfigurable) {
            if(other.check_sname(lname)) {
                return lname;
            }
        }
    }
    if(bothConfigurable && snames_.empty() && lnames_.empty() && !pname_.empty()) {
        if(other.check_sname(pname_) || other.check_lname(pname_) || pname_ == other.pname_)
            return pname_;
    }
    if(bothConfigurable && other.snames_.empty() && other.fnames_.empty() && !other.pname_.empty()) {
        if(check_sname(other.pname_) || check_lname(other.pname_) || (pname_ == other.pname_))
            return other.pname_;
    }
    if(ignore_case_ ||
       ignore_underscore_) {  // We need to do the inverse, in case we are ignore_case or ignore underscore
        for(const std::string &sname : other.snames_)
            if(check_sname(sname))
                return sname;
        for(const std::string &lname : other.lnames_)
            if(check_lname(lname))
                return lname;
    }
    return estring;
}